

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
          (CreatePBufferSurface *this,EGLDisplay display,EGLConfig config,EGLint width,EGLint height
          ,SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface)

{
  Surface *this_00;
  undefined1 local_60 [48];
  SharedPtrStateBase *local_30;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface_local;
  EGLint height_local;
  EGLint width_local;
  EGLConfig config_local;
  EGLDisplay display_local;
  CreatePBufferSurface *this_local;
  
  local_30 = (SharedPtrStateBase *)surface;
  surface_local._0_4_ = height;
  surface_local._4_4_ = width;
  _height_local = config;
  config_local = display;
  display_local = this;
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"CreatePBufferSurface");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CreatePBufferSurface_032775a8;
  this->m_display = config_local;
  this->m_config = _height_local;
  this->m_width = surface_local._4_4_;
  this->m_height = (EGLint)surface_local;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&this->m_surface);
  this_00 = (Surface *)operator_new(0x40);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_60);
  Surface::Surface(this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)(local_60 + 0x10),this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator=
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_30,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)(local_60 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)(local_60 + 0x10));
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator=
            (&this->m_surface,(SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_30);
  return;
}

Assistant:

CreatePBufferSurface::CreatePBufferSurface (EGLDisplay display, EGLConfig config, EGLint width, EGLint height, SharedPtr<Surface>& surface)
	: tcu::ThreadUtil::Operation	("CreatePBufferSurface")
	, m_display					(display)
	, m_config					(config)
	, m_width					(width)
	, m_height					(height)
{
	surface = SharedPtr<Surface>(new Surface(getEvent()));
	m_surface = surface;
}